

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktClippingTests.cpp
# Opt level: O3

void vkt::clipping::anon_unknown_0::addClippingTests(TestCaseGroup *clippingTestsGroup)

{
  VkPrimitiveTopology VVar1;
  TestContext *pTVar2;
  TestNode *pTVar3;
  TestNode *pTVar4;
  TestNode *node;
  undefined8 extraout_RAX;
  long *plVar5;
  ulong uVar6;
  undefined8 *puVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  string *psVar9;
  long *plVar10;
  ulong *puVar11;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  undefined8 extraout_RDX_09;
  undefined8 extraout_RDX_10;
  undefined8 uVar12;
  char **extraout_RDX_11;
  char **extraout_RDX_12;
  char **extraout_RDX_13;
  char **value;
  byte bVar13;
  uint uVar14;
  int arg0;
  _Alloc_hider testFunc;
  LineOrientation arg0_00;
  char *__end;
  char *__end_3;
  long lVar15;
  string mainGroupName;
  string caseName;
  string shaderGroupName;
  string local_2d0;
  TestNode *local_2b0;
  char local_2a5;
  uint local_2a4;
  TestContext *local_2a0;
  long *local_298;
  undefined8 local_290;
  long local_288;
  undefined8 uStack_280;
  TestNode *local_278;
  uint local_270;
  uint local_26c;
  TestNode *local_268;
  TestNode *local_260;
  long local_258;
  long *local_250;
  long local_248;
  long local_240;
  long lStack_238;
  anon_struct_24_3_c7e9beb3 *local_230;
  ulong *local_228;
  long local_220;
  ulong local_218;
  long lStack_210;
  uint local_204;
  TestNode *local_200;
  ulong *local_1f8;
  long local_1f0;
  ulong local_1e8 [2];
  ulong local_1d8;
  pointer local_1d0;
  undefined1 local_1c8 [112];
  ios_base local_158 [264];
  long *local_50 [2];
  long local_40 [2];
  
  pTVar2 = (clippingTestsGroup->super_TestNode).m_testCtx;
  local_200 = &clippingTestsGroup->super_TestNode;
  pTVar3 = (TestNode *)operator_new(0x70);
  local_2a0 = pTVar2;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,pTVar2,"clip_volume","clipping with the clip volume");
  pTVar4 = (TestNode *)operator_new(0x70);
  local_2b0 = pTVar3;
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar4,local_2a0,"inside","");
  lVar15 = 0;
  uVar12 = extraout_RDX;
  do {
    VVar1 = *(VkPrimitiveTopology *)((long)addClippingTests::cases + lVar15);
    drawutil::getPrimitiveTopologyShortName_abi_cxx11_
              ((string *)local_1c8,(drawutil *)(ulong)VVar1,(VkPrimitiveTopology)uVar12);
    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"","");
    pTVar3 = (TestNode *)
             createFunctionCaseWithPrograms<vk::VkPrimitiveTopology>
                       (pTVar4->m_testCtx,NODETYPE_SELF_VALIDATE,(string *)local_1c8,&local_2d0,
                        ClipVolume::initPrograms,ClipVolume::testPrimitivesInside,VVar1);
    tcu::TestNode::addChild(pTVar4,pTVar3);
    uVar12 = extraout_RDX_00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
      uVar12 = extraout_RDX_01;
    }
    if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
      operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
      uVar12 = extraout_RDX_02;
    }
    lVar15 = lVar15 + 4;
  } while (lVar15 != 0x28);
  tcu::TestNode::addChild(local_2b0,pTVar4);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar3,local_2a0,"outside","");
  lVar15 = 0;
  uVar12 = extraout_RDX_03;
  do {
    VVar1 = *(VkPrimitiveTopology *)((long)addClippingTests::cases + lVar15);
    drawutil::getPrimitiveTopologyShortName_abi_cxx11_
              ((string *)local_1c8,(drawutil *)(ulong)VVar1,(VkPrimitiveTopology)uVar12);
    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"","");
    pTVar4 = (TestNode *)
             createFunctionCaseWithPrograms<vk::VkPrimitiveTopology>
                       (pTVar3->m_testCtx,NODETYPE_SELF_VALIDATE,(string *)local_1c8,&local_2d0,
                        ClipVolume::initPrograms,ClipVolume::testPrimitivesOutside,VVar1);
    tcu::TestNode::addChild(pTVar3,pTVar4);
    uVar12 = extraout_RDX_04;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
      uVar12 = extraout_RDX_05;
    }
    if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
      operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
      uVar12 = extraout_RDX_06;
    }
    lVar15 = lVar15 + 4;
  } while (lVar15 != 0x28);
  tcu::TestNode::addChild(local_2b0,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar3,local_2a0,"depth_clamp","");
  lVar15 = 0;
  uVar12 = extraout_RDX_07;
  do {
    VVar1 = *(VkPrimitiveTopology *)((long)addClippingTests::cases + lVar15);
    drawutil::getPrimitiveTopologyShortName_abi_cxx11_
              ((string *)local_1c8,(drawutil *)(ulong)VVar1,(VkPrimitiveTopology)uVar12);
    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"","");
    arg0_00 = 0x3df18c;
    pTVar4 = (TestNode *)
             createFunctionCaseWithPrograms<vk::VkPrimitiveTopology>
                       (pTVar3->m_testCtx,NODETYPE_SELF_VALIDATE,(string *)local_1c8,&local_2d0,
                        ClipVolume::initPrograms,ClipVolume::testPrimitivesDepthClamp,VVar1);
    tcu::TestNode::addChild(pTVar3,pTVar4);
    uVar12 = extraout_RDX_08;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
      uVar12 = extraout_RDX_09;
    }
    if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
      operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
      uVar12 = extraout_RDX_10;
    }
    pTVar4 = local_2b0;
    lVar15 = lVar15 + 4;
  } while (lVar15 != 0x28);
  tcu::TestNode::addChild(local_2b0,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar3,local_2a0,"clipped","");
  local_1c8._0_8_ = local_1c8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"large_points","");
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"");
  pTVar2 = pTVar3->m_testCtx;
  node = (TestNode *)operator_new(0x80);
  testFunc._M_p = local_2d0._M_dataplus._M_p;
  tcu::TestCase::TestCase
            ((TestCase *)node,pTVar2,NODETYPE_SELF_VALIDATE,(char *)local_1c8._0_8_,
             local_2d0._M_dataplus._M_p);
  node->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d221b0;
  node[1]._vptr_TestNode = (_func_int **)ClipVolume::initProgramsPointSize;
  node[1].m_testCtx = (TestContext *)ClipVolume::testLargePoints;
  tcu::TestNode::addChild(pTVar3,node);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
    operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
  }
  local_1c8._0_8_ = local_1c8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"wide_lines_axis_aligned","");
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"");
  addFunctionCaseWithPrograms<vkt::clipping::(anonymous_namespace)::ClipVolume::LineOrientation>
            ((TestCaseGroup *)pTVar3,(string *)local_1c8._0_8_,(string *)local_2d0._M_dataplus._M_p,
             (Function)0x0,(Function)testFunc._M_p,arg0_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  if ((string *)local_1c8._0_8_ != (string *)(local_1c8 + 0x10)) {
    operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
  }
  local_1c8._0_8_ = local_1c8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"wide_lines_diagonal","");
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"");
  addFunctionCaseWithPrograms<vkt::clipping::(anonymous_namespace)::ClipVolume::LineOrientation>
            ((TestCaseGroup *)pTVar3,(string *)local_1c8._0_8_,(string *)local_2d0._M_dataplus._M_p,
             (Function)&DAT_00000001,(Function)testFunc._M_p,arg0_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  if ((string *)local_1c8._0_8_ != (string *)(local_1c8 + 0x10)) {
    operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
  }
  tcu::TestNode::addChild(pTVar4,pTVar3);
  tcu::TestNode::addChild(local_200,pTVar4);
  local_268 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_268,local_2a0,"user_defined","user-defined clip planes");
  local_270 = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
  lVar15 = 0;
  value = extraout_RDX_11;
  do {
    local_230 = addClippingTests::caseGroups + lVar15;
    bVar13 = 0;
    local_26c = (uint)CONCAT71((int7)((ulong)local_230 >> 8),1);
    do {
      de::toString<char_const*>((string *)local_1c8,(de *)local_230,value);
      plVar5 = (long *)std::__cxx11::string::append((char *)local_1c8);
      local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 == paVar8) {
        local_2d0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
        local_2d0.field_2._8_8_ = plVar5[3];
      }
      else {
        local_2d0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
        local_2d0._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_2d0._M_string_length = plVar5[1];
      *plVar5 = (long)paVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if ((string *)local_1c8._0_8_ != (string *)(local_1c8 + 0x10)) {
        operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
      }
      local_260 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)local_260,local_2a0,local_2d0._M_dataplus._M_p,"");
      local_1d8 = (ulong)bVar13 << 0x20;
      local_2a4 = 0;
      do {
        local_298 = &local_288;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"vert","");
        uVar14 = local_2a4 & 1;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_298);
        local_1c8._0_8_ = local_1c8 + 0x10;
        psVar9 = (string *)(plVar5 + 2);
        if ((string *)*plVar5 == psVar9) {
          local_1c8._16_8_ = (psVar9->_M_dataplus)._M_p;
          local_1c8._24_8_ = plVar5[3];
        }
        else {
          local_1c8._16_8_ = (psVar9->_M_dataplus)._M_p;
          local_1c8._0_8_ = (string *)*plVar5;
        }
        local_1c8._8_8_ = plVar5[1];
        *plVar5 = (long)psVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)local_1c8);
        local_250 = &local_240;
        plVar10 = plVar5 + 2;
        if ((long *)*plVar5 == plVar10) {
          local_240 = *plVar10;
          lStack_238 = plVar5[3];
        }
        else {
          local_240 = *plVar10;
          local_250 = (long *)*plVar5;
        }
        local_248 = plVar5[1];
        *plVar5 = (long)plVar10;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        if ((string *)local_1c8._0_8_ != (string *)(local_1c8 + 0x10)) {
          operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
        }
        if (local_298 != &local_288) {
          operator_delete(local_298,local_288 + 1);
        }
        pTVar3 = (TestNode *)operator_new(0x70);
        tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar3,local_2a0,(char *)local_250,"");
        uVar6 = 10;
        if (uVar14 == 0) {
          uVar6 = 3;
        }
        local_2a5 = local_230->useCullDistance;
        local_1d0 = (pointer)((ulong)(1 < local_2a4) << 0x30 |
                             (ulong)uVar14 << 0x28 | uVar6 | local_1d8);
        local_258 = 1;
        uVar14 = 7;
        local_278 = pTVar3;
        do {
          local_2b0 = (TestNode *)0x0;
          if (local_2a5 != '\0') {
            local_2b0 = (TestNode *)(ulong)uVar14;
          }
          local_204 = uVar14;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
          pTVar3 = local_278;
          std::ostream::operator<<((string *)local_1c8,(int)local_258);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
          std::ios_base::~ios_base(local_158);
          if ((int)local_2b0 < 1) {
            local_228 = &local_218;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"");
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
            std::ostream::operator<<((string *)local_1c8,(int)local_2b0);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
            std::ios_base::~ios_base(local_158);
            plVar5 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0xad59de);
            puVar11 = (ulong *)(plVar5 + 2);
            if ((ulong *)*plVar5 == puVar11) {
              local_218 = *puVar11;
              lStack_210 = plVar5[3];
              local_228 = &local_218;
            }
            else {
              local_218 = *puVar11;
              local_228 = (ulong *)*plVar5;
            }
            local_220 = plVar5[1];
            *plVar5 = (long)puVar11;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
          }
          uVar6 = 0xf;
          if (local_1f8 != local_1e8) {
            uVar6 = local_1e8[0];
          }
          if (uVar6 < (ulong)(local_220 + local_1f0)) {
            uVar6 = 0xf;
            if (local_228 != &local_218) {
              uVar6 = local_218;
            }
            if (uVar6 < (ulong)(local_220 + local_1f0)) goto LAB_003ddde4;
            puVar7 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_228,0,(char *)0x0,(ulong)local_1f8)
            ;
          }
          else {
LAB_003ddde4:
            puVar7 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_1f8,(ulong)local_228);
          }
          local_298 = &local_288;
          plVar5 = puVar7 + 2;
          if ((long *)*puVar7 == plVar5) {
            local_288 = *plVar5;
            uStack_280 = puVar7[3];
          }
          else {
            local_288 = *plVar5;
            local_298 = (long *)*puVar7;
          }
          local_290 = puVar7[1];
          *puVar7 = plVar5;
          puVar7[1] = 0;
          *(undefined1 *)plVar5 = 0;
          if (local_228 != &local_218) {
            operator_delete(local_228,local_218 + 1);
          }
          if ((0 < (int)local_2b0) && (local_50[0] != local_40)) {
            operator_delete(local_50[0],local_40[0] + 1);
          }
          if (local_1f8 != local_1e8) {
            operator_delete(local_1f8,local_1e8[0] + 1);
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_1c8,local_230->description,(allocator<char> *)&local_1f8);
          uVar12 = local_1c8._0_8_;
          plVar5 = local_298;
          pTVar2 = pTVar3->m_testCtx;
          pTVar3 = (TestNode *)operator_new(0x90);
          tcu::TestCase::TestCase
                    ((TestCase *)pTVar3,pTVar2,NODETYPE_SELF_VALIDATE,(char *)plVar5,(char *)uVar12)
          ;
          pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d22070;
          pTVar3[1]._vptr_TestNode = (_func_int **)ClipDistance::initPrograms;
          pTVar3[1].m_testCtx = (TestContext *)ClipDistance::testClipDistance;
          pTVar3[1].m_name._M_dataplus._M_p = local_1d0;
          pTVar3[1].m_name._M_string_length = ((long)local_2b0 << 0x20) + local_258;
          tcu::TestNode::addChild(local_278,pTVar3);
          if ((string *)local_1c8._0_8_ != (string *)(local_1c8 + 0x10)) {
            operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
          }
          if (local_298 != &local_288) {
            operator_delete(local_298,local_288 + 1);
          }
          local_258 = local_258 + 1;
          uVar14 = local_204 - 1;
        } while (local_258 != 9);
        tcu::TestNode::addChild(local_260,local_278);
        if (local_250 != &local_240) {
          operator_delete(local_250,local_240 + 1);
        }
        local_2a4 = local_2a4 + 1;
      } while (local_2a4 != 4);
      tcu::TestNode::addChild(local_268,local_260);
      value = extraout_RDX_12;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
        operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
        value = extraout_RDX_13;
      }
      bVar13 = 1;
      uVar14 = local_26c & 1;
      local_26c = 0;
    } while (uVar14 != 0);
    lVar15 = 1;
    uVar14 = local_270 & 1;
    local_270 = 0;
    if (uVar14 == 0) {
      pTVar3 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar3,local_2a0,"complementarity","");
      arg0 = 1;
      do {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
        std::ostream::operator<<((string *)local_1c8,arg0);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
        std::ios_base::~ios_base(local_158);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2d0,(char *)local_250,(allocator<char> *)&local_298);
        local_1c8._0_8_ = local_1c8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"","");
        pTVar4 = (TestNode *)
                 createFunctionCaseWithPrograms<int>
                           (pTVar3->m_testCtx,NODETYPE_SELF_VALIDATE,&local_2d0,(string *)local_1c8,
                            ClipDistanceComplementarity::initPrograms,
                            ClipDistanceComplementarity::testComplementarity,arg0);
        tcu::TestNode::addChild(pTVar3,pTVar4);
        if ((string *)local_1c8._0_8_ != (string *)(local_1c8 + 0x10)) {
          operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
          operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
        }
        if (local_250 != &local_240) {
          operator_delete(local_250,local_240 + 1);
        }
        pTVar4 = local_200;
        arg0 = arg0 + 1;
      } while (arg0 != 9);
      tcu::TestNode::addChild(local_200,pTVar3);
      tcu::TestNode::addChild(pTVar4,local_268);
      return;
    }
  } while( true );
}

Assistant:

void addClippingTests (tcu::TestCaseGroup* clippingTestsGroup)
{
	tcu::TestContext& testCtx = clippingTestsGroup->getTestContext();

	// Clipping against the clip volume
	{
		using namespace ClipVolume;

		static const VkPrimitiveTopology cases[] =
		{
			VK_PRIMITIVE_TOPOLOGY_POINT_LIST,
			VK_PRIMITIVE_TOPOLOGY_LINE_LIST,
			VK_PRIMITIVE_TOPOLOGY_LINE_LIST_WITH_ADJACENCY,
			VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,
			VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY,
			VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,
			VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY,
			VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,
			VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY,
			VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN,
		};

		MovePtr<tcu::TestCaseGroup> clipVolumeGroup(new tcu::TestCaseGroup(testCtx, "clip_volume", "clipping with the clip volume"));

		// Fully inside the clip volume
		{
			MovePtr<tcu::TestCaseGroup> group(new tcu::TestCaseGroup(testCtx, "inside", ""));

			for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); ++caseNdx)
				addFunctionCaseWithPrograms<VkPrimitiveTopology>(
					group.get(), getPrimitiveTopologyShortName(cases[caseNdx]), "", initPrograms, testPrimitivesInside, cases[caseNdx]);

			clipVolumeGroup->addChild(group.release());
		}

		// Fully outside the clip volume
		{
			MovePtr<tcu::TestCaseGroup> group(new tcu::TestCaseGroup(testCtx, "outside", ""));

			for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); ++caseNdx)
				addFunctionCaseWithPrograms<VkPrimitiveTopology>(
					group.get(), getPrimitiveTopologyShortName(cases[caseNdx]), "", initPrograms, testPrimitivesOutside, cases[caseNdx]);

			clipVolumeGroup->addChild(group.release());
		}

		// Depth clamping
		{
			MovePtr<tcu::TestCaseGroup> group(new tcu::TestCaseGroup(testCtx, "depth_clamp", ""));

			for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); ++caseNdx)
				addFunctionCaseWithPrograms<VkPrimitiveTopology>(
					group.get(), getPrimitiveTopologyShortName(cases[caseNdx]), "", initPrograms, testPrimitivesDepthClamp, cases[caseNdx]);

			clipVolumeGroup->addChild(group.release());
		}

		// Large points and wide lines
		{
			// \note For both points and lines, if an unsupported size/width is selected, the nearest supported size will be chosen.
			//       We do have to check for feature support though.

			MovePtr<tcu::TestCaseGroup> group(new tcu::TestCaseGroup(testCtx, "clipped", ""));

			addFunctionCaseWithPrograms(group.get(), "large_points", "", initProgramsPointSize, testLargePoints);

			addFunctionCaseWithPrograms<LineOrientation>(group.get(), "wide_lines_axis_aligned", "", initPrograms, testWideLines, LINE_ORIENTATION_AXIS_ALIGNED);
			addFunctionCaseWithPrograms<LineOrientation>(group.get(), "wide_lines_diagonal",	 "", initPrograms, testWideLines, LINE_ORIENTATION_DIAGONAL);

			clipVolumeGroup->addChild(group.release());
		}

		clippingTestsGroup->addChild(clipVolumeGroup.release());
	}

	// User-defined clip planes
	{
		MovePtr<tcu::TestCaseGroup> clipDistanceGroup(new tcu::TestCaseGroup(testCtx, "user_defined", "user-defined clip planes"));

		// ClipDistance, CullDistance and maxCombinedClipAndCullDistances usage
		{
			using namespace ClipDistance;

			static const struct
			{
				const char* const	groupName;
				const char* const	description;
				bool				useCullDistance;
			} caseGroups[] =
			{
				{ "clip_distance",		"use ClipDistance",										false },
				{ "clip_cull_distance",	"use ClipDistance and CullDistance at the same time",	true  },
			};

			const deUint32 flagTessellation = 1u << 0;
			const deUint32 flagGeometry		= 1u << 1;

			for (int groupNdx = 0; groupNdx < DE_LENGTH_OF_ARRAY(caseGroups); ++groupNdx)
			for (int indexingMode = 0; indexingMode < 2; ++indexingMode)
			{
				const bool			dynamicIndexing	= (indexingMode == 1);
				const std::string	mainGroupName	= de::toString(caseGroups[groupNdx].groupName) + (dynamicIndexing ? "_dynamic_index" : "");

				MovePtr<tcu::TestCaseGroup>	mainGroup(new tcu::TestCaseGroup(testCtx, mainGroupName.c_str(), ""));

				for (deUint32 shaderMask = 0u; shaderMask <= (flagTessellation | flagGeometry); ++shaderMask)
				{
					const bool			useTessellation	= (shaderMask & flagTessellation) != 0;
					const bool			useGeometry		= (shaderMask & flagGeometry) != 0;
					const std::string	shaderGroupName	= std::string("vert") + (useTessellation ? "_tess" : "") + (useGeometry ? "_geom" : "");

					MovePtr<tcu::TestCaseGroup>	shaderGroup(new tcu::TestCaseGroup(testCtx, shaderGroupName.c_str(), ""));

					for (int numClipPlanes = 1; numClipPlanes <= MAX_CLIP_DISTANCES; ++numClipPlanes)
					{
						const int					numCullPlanes	= (caseGroups[groupNdx].useCullDistance
																		? std::min(static_cast<int>(MAX_CULL_DISTANCES), MAX_COMBINED_CLIP_AND_CULL_DISTANCES - numClipPlanes)
																		: 0);
						const std::string			caseName		= de::toString(numClipPlanes) + (numCullPlanes > 0 ? "_" + de::toString(numCullPlanes) : "");
						const VkPrimitiveTopology	topology		= (useTessellation ? VK_PRIMITIVE_TOPOLOGY_PATCH_LIST : VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST);

						addFunctionCaseWithPrograms<CaseDefinition>(
							shaderGroup.get(), caseName, caseGroups[groupNdx].description, initPrograms, testClipDistance,
							CaseDefinition(topology, numClipPlanes, numCullPlanes, useTessellation, useGeometry, dynamicIndexing));
					}
					mainGroup->addChild(shaderGroup.release());
				}
				clipDistanceGroup->addChild(mainGroup.release());
			}
		}

		// Complementarity criterion (i.e. clipped and not clipped areas must add up to a complete primitive with no holes nor overlap)
		{
			using namespace ClipDistanceComplementarity;

			MovePtr<tcu::TestCaseGroup>	group(new tcu::TestCaseGroup(testCtx, "complementarity", ""));

			for (int numClipDistances = 1; numClipDistances <= MAX_CLIP_DISTANCES; ++numClipDistances)
				addFunctionCaseWithPrograms<int>(group.get(), de::toString(numClipDistances).c_str(), "", initPrograms, testComplementarity, numClipDistances);

			clippingTestsGroup->addChild(group.release());
		}

		clippingTestsGroup->addChild(clipDistanceGroup.release());
	}
}